

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Elf32.cpp
# Opt level: O0

Elf32_Ehdr * elf::arch32::GetHeader(void *data)

{
  uint8_t uVar1;
  Elf32_Ehdr *ret;
  void *data_local;
  
  if (*data == 0x464c457f) {
    uVar1 = GetClass(data);
    data_local = data;
    if (uVar1 != '\x01') {
      data_local = (void *)0x0;
    }
  }
  else {
    data_local = (void *)0x0;
  }
  return (Elf32_Ehdr *)data_local;
}

Assistant:

Elf32_Ehdr* elf::arch32::GetHeader(void* data) {
    Elf32_Ehdr* ret = (Elf32_Ehdr*) data;

    if(memcmp(ret->e_ident, ELFMAG, SELFMAG) != 0)
        return NULL; // Invalid ELF

    if(GetClass(data) != ELFCLASS32)
        return NULL; // x64 only

    return ret;
}